

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_quantize.c
# Opt level: O1

void av1_highbd_quantize_fp_facade
               (tran_low_t *coeff_ptr,intptr_t n_coeffs,MACROBLOCK_PLANE *p,tran_low_t *qcoeff_ptr,
               tran_low_t *dqcoeff_ptr,uint16_t *eob_ptr,SCAN_ORDER *sc,QUANT_PARAM *qparam)

{
  qm_val_t *in_RAX;
  qm_val_t *unaff_RBX;
  int unaff_R12D;
  
  if ((int16_t *)qparam->iqmatrix == (int16_t *)0x0 ||
      (uint16_t *)qparam->qmatrix == (uint16_t *)0x0) {
    (*av1_highbd_quantize_fp)
              (coeff_ptr,n_coeffs,p->zbin_QTX,p->round_fp_QTX,p->quant_fp_QTX,p->quant_shift_QTX,
               qcoeff_ptr,dqcoeff_ptr,p->dequant_QTX,eob_ptr,sc->scan,sc->iscan,qparam->log_scale);
  }
  else {
    highbd_quantize_fp_helper_c
              (coeff_ptr,n_coeffs,p->round_fp_QTX,p->quant_fp_QTX,(int16_t *)qcoeff_ptr,
               (int16_t *)dqcoeff_ptr,(tran_low_t *)p->dequant_QTX,(tran_low_t *)eob_ptr,sc->scan,
               (uint16_t *)qparam->qmatrix,(int16_t *)qparam->iqmatrix,
               (int16_t *)(ulong)(uint)qparam->log_scale,in_RAX,unaff_RBX,unaff_R12D);
  }
  return;
}

Assistant:

void av1_highbd_quantize_fp_facade(const tran_low_t *coeff_ptr,
                                   intptr_t n_coeffs, const MACROBLOCK_PLANE *p,
                                   tran_low_t *qcoeff_ptr,
                                   tran_low_t *dqcoeff_ptr, uint16_t *eob_ptr,
                                   const SCAN_ORDER *sc,
                                   const QUANT_PARAM *qparam) {
  const qm_val_t *qm_ptr = qparam->qmatrix;
  const qm_val_t *iqm_ptr = qparam->iqmatrix;
  if (qm_ptr != NULL && iqm_ptr != NULL) {
    highbd_quantize_fp_helper_c(
        coeff_ptr, n_coeffs, p->zbin_QTX, p->round_fp_QTX, p->quant_fp_QTX,
        p->quant_shift_QTX, qcoeff_ptr, dqcoeff_ptr, p->dequant_QTX, eob_ptr,
        sc->scan, sc->iscan, qm_ptr, iqm_ptr, qparam->log_scale);
  } else {
    av1_highbd_quantize_fp(coeff_ptr, n_coeffs, p->zbin_QTX, p->round_fp_QTX,
                           p->quant_fp_QTX, p->quant_shift_QTX, qcoeff_ptr,
                           dqcoeff_ptr, p->dequant_QTX, eob_ptr, sc->scan,
                           sc->iscan, qparam->log_scale);
  }
}